

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int make_header(archive_write *a,uint64_t offset,uint64_t pack_size,uint64_t unpack_size,
               int codernum,coder *coders)

{
  ssize_t sVar1;
  uint local_60;
  undefined1 local_5c [4];
  uint32_t attr;
  uint32_t encattr;
  uint8_t mask;
  uint8_t b;
  uintptr_t uStack_50;
  int r;
  file *file;
  _7zip_conflict *zip;
  coder *coders_local;
  uint64_t uStack_30;
  int codernum_local;
  uint64_t unpack_size_local;
  uint64_t pack_size_local;
  uint64_t offset_local;
  archive_write *a_local;
  
  file = (file *)a->format_data;
  zip = (_7zip_conflict *)coders;
  coders_local._4_4_ = codernum;
  uStack_30 = unpack_size;
  unpack_size_local = pack_size;
  pack_size_local = offset;
  offset_local = (uint64_t)a;
  encattr = enc_uint64(a,1);
  a_local._4_4_ = encattr;
  if (((-1 < (int)encattr) &&
      (((*(long *)&file->name_len == 0 ||
        ((encattr = enc_uint64((archive_write *)offset_local,4), a_local._4_4_ = encattr,
         -1 < (int)encattr &&
         (encattr = make_streamsInfo((archive_write *)offset_local,pack_size_local,unpack_size_local
                                     ,uStack_30,coders_local._4_4_,(coder *)zip,1,0),
         a_local._4_4_ = encattr, -1 < (int)encattr)))) &&
       (encattr = enc_uint64((archive_write *)offset_local,5), a_local._4_4_ = encattr,
       -1 < (int)encattr)))) &&
     (encattr = enc_uint64((archive_write *)offset_local,(uint64_t)file->next),
     a_local._4_4_ = encattr, -1 < (int)encattr)) {
    if (file->utf16name != (uint8_t *)0x0) {
      encattr = enc_uint64((archive_write *)offset_local,0xe);
      if ((int)encattr < 0) {
        return encattr;
      }
      encattr = enc_uint64((archive_write *)offset_local,
                           (ulong)((long)(file->next->rbnode).rb_nodes + 7U) >> 3);
      if ((int)encattr < 0) {
        return encattr;
      }
      attr._3_1_ = 0;
      attr._2_1_ = 0x80;
      for (uStack_50 = file[0x1e2].rbnode.rb_info; uStack_50 != 0;
          uStack_50 = *(uintptr_t *)(uStack_50 + 0x18)) {
        if (*(long *)(uStack_50 + 0x30) == 0) {
          attr._3_1_ = attr._3_1_ | attr._2_1_;
        }
        attr._2_1_ = (byte)((int)(uint)attr._2_1_ >> 1);
        if (attr._2_1_ == 0) {
          sVar1 = compress_out((archive_write *)offset_local,(void *)((long)&attr + 3),1,
                               ARCHIVE_Z_RUN);
          encattr = (uint32_t)sVar1;
          if ((int)encattr < 0) {
            return encattr;
          }
          attr._2_1_ = 0x80;
          attr._3_1_ = 0;
        }
      }
      if (attr._2_1_ != 0x80) {
        sVar1 = compress_out((archive_write *)offset_local,(void *)((long)&attr + 3),1,ARCHIVE_Z_RUN
                            );
        encattr = (uint32_t)sVar1;
        if ((int)encattr < 0) {
          return encattr;
        }
      }
    }
    if ((uint8_t *)file->size < file->utf16name) {
      encattr = enc_uint64((archive_write *)offset_local,0xf);
      if ((int)encattr < 0) {
        return encattr;
      }
      encattr = enc_uint64((archive_write *)offset_local,(ulong)(file->utf16name + 7) >> 3);
      if ((int)encattr < 0) {
        return encattr;
      }
      attr._3_1_ = 0;
      attr._2_1_ = 0x80;
      for (uStack_50 = file[0x1e2].rbnode.rb_info; uStack_50 != 0;
          uStack_50 = *(uintptr_t *)(uStack_50 + 0x18)) {
        if (*(long *)(uStack_50 + 0x30) == 0) {
          if ((*(byte *)(uStack_50 + 0x78) & 1) == 0) {
            attr._3_1_ = attr._3_1_ | attr._2_1_;
          }
          attr._2_1_ = (byte)((int)(uint)attr._2_1_ >> 1);
          if (attr._2_1_ == 0) {
            sVar1 = compress_out((archive_write *)offset_local,(void *)((long)&attr + 3),1,
                                 ARCHIVE_Z_RUN);
            encattr = (uint32_t)sVar1;
            if ((int)encattr < 0) {
              return encattr;
            }
            attr._2_1_ = 0x80;
            attr._3_1_ = 0;
          }
        }
      }
      if (attr._2_1_ != 0x80) {
        sVar1 = compress_out((archive_write *)offset_local,(void *)((long)&attr + 3),1,ARCHIVE_Z_RUN
                            );
        encattr = (uint32_t)sVar1;
        if ((int)encattr < 0) {
          return encattr;
        }
      }
    }
    encattr = enc_uint64((archive_write *)offset_local,0x11);
    a_local._4_4_ = encattr;
    if (((-1 < (int)encattr) &&
        (encattr = enc_uint64((archive_write *)offset_local,*(long *)&file->flg + 1),
        a_local._4_4_ = encattr, -1 < (int)encattr)) &&
       (encattr = enc_uint64((archive_write *)offset_local,0), a_local._4_4_ = encattr,
       -1 < (int)encattr)) {
      for (uStack_50 = file[0x1e2].rbnode.rb_info; uStack_50 != 0;
          uStack_50 = *(uintptr_t *)(uStack_50 + 0x18)) {
        sVar1 = compress_out((archive_write *)offset_local,*(void **)(uStack_50 + 0x28),
                             (ulong)(*(int *)(uStack_50 + 0x20) + 2),ARCHIVE_Z_RUN);
        encattr = (uint32_t)sVar1;
        if ((int)encattr < 0) {
          return encattr;
        }
      }
      encattr = make_time((archive_write *)offset_local,'\x14',1,0);
      a_local._4_4_ = encattr;
      if ((((-1 < (int)encattr) &&
           (encattr = make_time((archive_write *)offset_local,'\x12',4,2), a_local._4_4_ = encattr,
           -1 < (int)encattr)) &&
          ((encattr = make_time((archive_write *)offset_local,'\x13',2,1), a_local._4_4_ = encattr,
           -1 < (int)encattr &&
           ((encattr = enc_uint64((archive_write *)offset_local,0x15), a_local._4_4_ = encattr,
            -1 < (int)encattr &&
            (encattr = enc_uint64((archive_write *)offset_local,(long)file->next * 4 + 2),
            a_local._4_4_ = encattr, -1 < (int)encattr)))))) &&
         ((encattr = enc_uint64((archive_write *)offset_local,1), a_local._4_4_ = encattr,
          -1 < (int)encattr &&
          (encattr = enc_uint64((archive_write *)offset_local,0), a_local._4_4_ = encattr,
          -1 < (int)encattr)))) {
        for (uStack_50 = file[0x1e2].rbnode.rb_info; uStack_50 != 0;
            uStack_50 = *(uintptr_t *)(uStack_50 + 0x18)) {
          if ((*(byte *)(uStack_50 + 0x78) & 1) == 0) {
            local_60 = 0x20;
          }
          else {
            local_60 = 0x10;
          }
          if ((*(uint *)(uStack_50 + 0x70) & 0x92) == 0) {
            local_60 = local_60 | 1;
          }
          archive_le32enc(local_5c,*(int *)(uStack_50 + 0x70) << 0x10 | local_60 | 0x8000);
          sVar1 = compress_out((archive_write *)offset_local,local_5c,4,ARCHIVE_Z_RUN);
          encattr = (uint32_t)sVar1;
          if ((int)encattr < 0) {
            return encattr;
          }
        }
        encattr = enc_uint64((archive_write *)offset_local,0);
        a_local._4_4_ = encattr;
        if ((-1 < (int)encattr) &&
           (a_local._4_4_ = enc_uint64((archive_write *)offset_local,0), -1 < (int)a_local._4_4_)) {
          a_local._4_4_ = 0;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
make_header(struct archive_write *a, uint64_t offset, uint64_t pack_size,
    uint64_t unpack_size, int codernum, struct coder *coders)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	struct file *file;
	int r;
	uint8_t b, mask;

	/*
	 * Make FilesInfo.
	 */
	r = enc_uint64(a, kHeader);
	if (r < 0)
		return (r);

	/*
	 * If there are empty files only, do not write MainStreamInfo.
	 */
	if (zip->total_number_nonempty_entry) {
		/*
		 * Make MainStreamInfo.
		 */
		r = enc_uint64(a, kMainStreamsInfo);
		if (r < 0)
			return (r);
		r = make_streamsInfo(a, offset, pack_size, unpack_size,
		      codernum, coders, 1, 0);
		if (r < 0)
			return (r);
	}

	/*
	 * Make FilesInfo.
	 */
	r = enc_uint64(a, kFilesInfo);
	if (r < 0)
		return (r);

	/* Write numFiles. */
	r = enc_uint64(a, zip->total_number_entry);
	if (r < 0)
		return (r);

	if (zip->total_number_empty_entry > 0) {
		/* Make EmptyStream. */
		r = enc_uint64(a, kEmptyStream);
		if (r < 0)
			return (r);

		/* Write EmptyStream Size. */
		r = enc_uint64(a, (zip->total_number_entry+7)>>3);
		if (r < 0)
			return (r);

		b = 0;
		mask = 0x80;
		file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				b |= mask;
			mask >>= 1;
			if (mask == 0) {
				r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
				mask = 0x80;
				b = 0;
			}
		}
		if (mask != 0x80) {
			r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);
		}
	}

	if (zip->total_number_empty_entry > zip->total_number_dir_entry) {
		/* Make EmptyFile. */
		r = enc_uint64(a, kEmptyFile);
		if (r < 0)
			return (r);

		/* Write EmptyFile Size. */
		r = enc_uint64(a, (zip->total_number_empty_entry + 7) >> 3);
		if (r < 0)
			return (r);

		b = 0;
		mask = 0x80;
		file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size)
				continue;
			if (!file->dir)
				b |= mask;
			mask >>= 1;
			if (mask == 0) {
				r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
				mask = 0x80;
				b = 0;
			}
		}
		if (mask != 0x80) {
			r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);
		}
	}

	/* Make Name. */
	r = enc_uint64(a, kName);
	if (r < 0)
		return (r);

	/* Write Name size. */
	r = enc_uint64(a, zip->total_bytes_entry_name+1);
	if (r < 0)
		return (r);

	/* Write dmy byte. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);

	file = zip->file_list.first;
	for (;file != NULL; file = file->next) {
		r = (int)compress_out(a, file->utf16name, file->name_len+2,
			ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Make MTime. */
	r = make_time(a, kMTime, MTIME_IS_SET, MTIME);
	if (r < 0)
		return (r);

	/* Make CTime. */
	r = make_time(a, kCTime, CTIME_IS_SET, CTIME);
	if (r < 0)
		return (r);

	/* Make ATime. */
	r = make_time(a, kATime, ATIME_IS_SET, ATIME);
	if (r < 0)
		return (r);

	/* Make Attributes. */
	r = enc_uint64(a, kAttributes);
	if (r < 0)
		return (r);

	/* Write Attributes size. */
	r = enc_uint64(a, 2 + zip->total_number_entry * 4);
	if (r < 0)
		return (r);

	/* Write "All Are Defined". */
	r = enc_uint64(a, 1);
	if (r < 0)
		return (r);

	/* Write dmy byte. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);

	file = zip->file_list.first;
	for (;file != NULL; file = file->next) {
		/*
		 * High 16bits is unix mode.
		 * Low 16bits is Windows attributes.
		 */
		uint32_t encattr, attr = 0;

		if (file->dir)
			attr |= FILE_ATTRIBUTE_DIRECTORY;
		else
			attr |= FILE_ATTRIBUTE_ARCHIVE;

		if ((file->mode & 0222) == 0)
			attr |= FILE_ATTRIBUTE_READONLY;

		attr |= FILE_ATTRIBUTE_UNIX_EXTENSION;
		attr |= ((uint32_t)file->mode) << 16;

		archive_le32enc(&encattr, attr);
		r = (int)compress_out(a, &encattr, 4, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	return (ARCHIVE_OK);
}